

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2ece268::PeerManagerImpl::ProcessBlockAvailability
          (PeerManagerImpl *this,NodeId nodeid)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr *hash;
  int iVar2;
  uchar *puVar3;
  CBlockIndex *pCVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  long in_FS_OFFSET;
  base_uint<256U> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(long *)(p_Var6 + 1) < nodeid]) {
    if (nodeid <= *(long *)(p_Var6 + 1)) {
      p_Var5 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var6 = p_Var5, nodeid < *(long *)(p_Var5 + 1))) {
    p_Var6 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x5bf,
                  "void (anonymous namespace)::PeerManagerImpl::ProcessBlockAvailability(NodeId)");
  }
  hash = &p_Var6[1]._M_left;
  puVar3 = std::
           __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                     (hash,&p_Var6[2]._M_left);
  if (((_Base_ptr *)puVar3 != &p_Var6[2]._M_left) &&
     (pCVar4 = ::node::BlockManager::LookupBlockIndex(&this->m_chainman->m_blockman,(uint256 *)hash)
     , pCVar4 != (CBlockIndex *)0x0)) {
    local_48.pn[4] = 0;
    local_48.pn[5] = 0;
    local_48.pn[6] = 0;
    local_48.pn[7] = 0;
    local_48.pn[0] = 0;
    local_48.pn[1] = 0;
    local_48.pn[2] = 0;
    local_48.pn[3] = 0;
    iVar2 = base_uint<256U>::CompareTo(&(pCVar4->nChainWork).super_base_uint<256U>,&local_48);
    if (0 < iVar2) {
      p_Var5 = p_Var6[1]._M_parent;
      if ((p_Var5 == (_Base_ptr)0x0) ||
         (iVar2 = base_uint<256U>::CompareTo
                            (&(pCVar4->nChainWork).super_base_uint<256U>,
                             (base_uint<256U> *)&p_Var5[1]._M_parent), -1 < iVar2)) {
        p_Var6[1]._M_parent = (_Base_ptr)pCVar4;
      }
      *(undefined8 *)(p_Var6 + 2) = 0;
      p_Var6[2]._M_parent = (_Base_ptr)0x0;
      *hash = (_Base_ptr)0x0;
      p_Var6[1]._M_right = (_Base_ptr)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::ProcessBlockAvailability(NodeId nodeid) {
    CNodeState *state = State(nodeid);
    assert(state != nullptr);

    if (!state->hashLastUnknownBlock.IsNull()) {
        const CBlockIndex* pindex = m_chainman.m_blockman.LookupBlockIndex(state->hashLastUnknownBlock);
        if (pindex && pindex->nChainWork > 0) {
            if (state->pindexBestKnownBlock == nullptr || pindex->nChainWork >= state->pindexBestKnownBlock->nChainWork) {
                state->pindexBestKnownBlock = pindex;
            }
            state->hashLastUnknownBlock.SetNull();
        }
    }
}